

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O1

Curl_dns_entry * Curl_fetch_addr(connectdata *conn,char *hostname,int port,int *stale)

{
  SessionHandle *pSVar1;
  char *__s;
  size_t sVar2;
  Curl_dns_entry *pCVar3;
  hostcache_prune_data *data;
  int iVar4;
  Curl_dns_entry *c;
  long local_38;
  long local_30;
  
  pSVar1 = conn->data;
  __s = create_hostcache_id(hostname,port);
  iVar4 = 0;
  if (__s == (char *)0x0) {
    pCVar3 = (Curl_dns_entry *)0x0;
  }
  else {
    sVar2 = strlen(__s);
    pCVar3 = (Curl_dns_entry *)Curl_hash_pick((pSVar1->dns).hostcache,__s,sVar2 + 1);
    (*Curl_cfree)(__s);
    if ((((pCVar3 != (Curl_dns_entry *)0x0) && ((pSVar1->set).dns_cache_timeout != -1)) &&
        ((pSVar1->dns).hostcache != (curl_hash *)0x0)) && (pCVar3->inuse == 0)) {
      time(&local_30);
      local_38 = (pSVar1->set).dns_cache_timeout;
      if ((pCVar3->inuse == 0) && (local_38 <= local_30 - pCVar3->timestamp)) {
        Curl_hash_clean_with_criterium((pSVar1->dns).hostcache,&local_38,hostcache_timestamp_remove)
        ;
        iVar4 = 1;
        pCVar3 = (Curl_dns_entry *)0x0;
      }
    }
    *stale = iVar4;
  }
  return pCVar3;
}

Assistant:

struct Curl_dns_entry *
Curl_fetch_addr(struct connectdata *conn,
                const char *hostname,
                int port, int *stale)
{
  char *entry_id = NULL;
  struct Curl_dns_entry *dns = NULL;
  size_t entry_len;
  struct SessionHandle *data = conn->data;

  /* Create an entry id, based upon the hostname and port */
  entry_id = create_hostcache_id(hostname, port);
  /* If we can't create the entry id, fail */
  if(!entry_id)
    return dns;

  entry_len = strlen(entry_id);

  /* See if its already in our dns cache */
  dns = Curl_hash_pick(data->dns.hostcache, entry_id, entry_len+1);

  /* free the allocated entry_id again */
  free(entry_id);

  /* See whether the returned entry is stale. Done before we release lock */
  *stale = remove_entry_if_stale(data, dns);
  if(*stale)
    dns = NULL; /* the memory deallocation is being handled by the hash */

  return dns;
}